

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void msgt(uint type,char *fmt,...)

{
  char local_438 [8];
  char buf [1024];
  va_list vp;
  char *fmt_local;
  uint type_local;
  
  buf[0x3fc] = '0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\x10';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  vstrnfmt(local_438,0x400,fmt,(__va_list_tag *)(buf + 0x3f8));
  if (messages != (msgqueue_t *)0x0) {
    message_add(local_438,(uint16_t)type);
    sound(type);
    event_signal_message(EVENT_MESSAGE,type,local_438);
  }
  return;
}

Assistant:

void msgt(unsigned int type, const char *fmt, ...)
{
	va_list vp;
	char buf[1024];
	va_start(vp, fmt);
	vstrnfmt(buf, sizeof(buf), fmt, vp);
	va_end(vp);

	/* Fail if messages not loaded */
	if (!messages) return;

	/* Add to message log */
	message_add(buf, type);

	/* Send refresh event */
	sound(type);
	event_signal_message(EVENT_MESSAGE, type, buf);
}